

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

AnyCellmlElementPtr __thiscall
libcellml::Annotator::AnnotatorImpl::convertToShared(AnnotatorImpl *this,AnyCellmlElementPtr *item)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  CellmlElementType type;
  CellmlElementType CVar4;
  int iVar5;
  undefined8 *puVar6;
  Component *__tmp;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  bool bVar9;
  AnyCellmlElementPtr AVar10;
  ResetPtr reset;
  VariablePtr variable;
  UnitsPtr units;
  ModelPtr model;
  ImportSourcePtr importSource;
  ComponentPtr component;
  VariablePairPtr variablePair;
  UnitsItemPtr unitsItem;
  ResetPtr local_a8;
  AnyCellmlElement local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  VariablePtr local_88;
  UnitsPtr local_78;
  ModelPtr local_68;
  ImportSourcePtr local_58;
  ComponentPtr local_48;
  VariablePairPtr local_38;
  UnitsItemPtr local_28;
  
  AnyCellmlElement::AnyCellmlElementImpl::create();
  type = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CVar4 = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  switch(CVar4) {
  case COMPONENT:
  case COMPONENT_REF:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::Component>>((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setComponent
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_48,type);
    _Var8._M_pi = extraout_RDX_01;
    break;
  case CONNECTION:
  case MAP_VARIABLES:
    AnyCellmlElement::variablePair(&local_98);
    _Var8._M_pi = local_38.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_38.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Stack_90;
    local_38.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98.mPimpl;
    local_98.mPimpl = (AnyCellmlElementImpl *)0x0;
    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setVariablePair
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_38,type);
    _Var8._M_pi = extraout_RDX;
    break;
  case ENCAPSULATION:
  case MODEL:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::Model>>((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setModel
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_68,type);
    _Var8._M_pi = extraout_RDX_02;
    break;
  case IMPORT:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::ImportSource>>
                       ((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_58);
    _Var8._M_pi = extraout_RDX_04;
    break;
  default:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::Variable>>((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_88);
    _Var8._M_pi = extraout_RDX_08;
    break;
  case RESET:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::Reset>>((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setReset
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_a8,RESET);
    _Var8._M_pi = extraout_RDX_05;
    break;
  case RESET_VALUE:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::Reset>>((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setResetValue
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_a8);
    _Var8._M_pi = extraout_RDX_07;
    break;
  case TEST_VALUE:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::Reset>>((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setTestValue
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_a8);
    _Var8._M_pi = extraout_RDX_06;
    break;
  case UNIT:
    AnyCellmlElement::unitsItem(&local_98);
    _Var8._M_pi = local_28.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_28.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_90;
    local_28.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98.mPimpl;
    local_98.mPimpl = (AnyCellmlElementImpl *)0x0;
    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setUnitsItem
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_28);
    _Var8._M_pi = extraout_RDX_00;
    break;
  case UNITS:
    puVar6 = (undefined8 *)
             std::__any_caster<std::weak_ptr<libcellml::Units>>((any *)(*(long *)*in_RDX + 8));
    _Var8._M_pi = local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (puVar6 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar6;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    p_Var7 = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var3->_M_use_count;
        do {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar9 = iVar5 == iVar2;
          if (bVar9) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
          p_Var7 = p_Var3;
        } while (!bVar9);
      }
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else if (p_Var7->_M_use_count == 0) {
      local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    bVar9 = local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var7;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setUnits
              ((AnyCellmlElementImpl *)
               *(this->super_LoggerImpl).mErrors.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_78);
    _Var8._M_pi = extraout_RDX_03;
  }
  if (local_38.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_09;
  }
  if (local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_10;
  }
  if (local_28.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_11;
  }
  if (local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var8._M_pi = extraout_RDX_12;
  }
  if (local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var8._M_pi = extraout_RDX_13;
  }
  if (local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var8._M_pi = extraout_RDX_14;
  }
  if (local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_15;
  }
  if (local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var8._M_pi = extraout_RDX_16;
  }
  AVar10.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  AVar10.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar10.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::AnnotatorImpl::convertToShared(const AnyCellmlElementPtr &item)
{
    auto converted = AnyCellmlElement::AnyCellmlElementImpl::create();
    auto type = item->type();

    ComponentPtr component;
    ImportSourcePtr importSource;
    ModelPtr model;
    ResetPtr reset;
    UnitsPtr units;
    UnitsItemPtr unitsItem;
    VariablePtr variable;
    VariablePairPtr variablePair;

    switch (item->type()) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF:
        component = std::any_cast<ComponentWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setComponent(component, type);
        break;
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
        variablePair = item->variablePair();
        converted->mPimpl->setVariablePair(variablePair, type);
        break;
    case CellmlElementType::ENCAPSULATION:
    case CellmlElementType::MODEL:
        model = std::any_cast<ModelWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setModel(model, type);
        break;
    case CellmlElementType::IMPORT:
        importSource = std::any_cast<ImportSourceWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setImportSource(importSource);
        break;
    case CellmlElementType::RESET:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setReset(reset);
        break;
    case CellmlElementType::RESET_VALUE:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setResetValue(reset);
        break;
    case CellmlElementType::TEST_VALUE:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setTestValue(reset);
        break;
    case CellmlElementType::UNIT:
        unitsItem = item->unitsItem();
        converted->mPimpl->setUnitsItem(unitsItem);
        break;
    case CellmlElementType::UNITS:
        units = std::any_cast<UnitsWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setUnits(units);
        break;
    default: /* CellmlElementType::VARIABLE */
        variable = std::any_cast<VariableWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setVariable(variable);
        break;
    }

    return converted;
}